

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
DiceRoller::roll(vector<int,_std::allocator<int>_> *__return_storage_ptr__,DiceRoller *this,
                int numDice)

{
  int *piVar1;
  iterator __position;
  long lVar2;
  long lVar3;
  long lVar4;
  vector<int,std::allocator<int>> *this_00;
  ulong uVar5;
  int result;
  int local_2c;
  
  this_00 = (vector<int,std::allocator<int>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  if (0 < numDice) {
    do {
      local_2c = Dice::roll();
      __position._M_current = *(int **)(this_00 + 8);
      if (__position._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,&local_2c);
      }
      else {
        *__position._M_current = local_2c;
        *(int **)(this_00 + 8) = __position._M_current + 1;
      }
      piVar1 = (this->history->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)local_2c + -1;
      *piVar1 = *piVar1 + 1;
      *this->diceRolled = *this->diceRolled + 1;
      numDice = numDice + -1;
    } while (numDice != 0);
    lVar2 = *(long *)this_00;
    lVar3 = *(long *)(this_00 + 8);
    if (lVar2 != lVar3) {
      uVar5 = lVar3 - lVar2 >> 2;
      lVar4 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar2,lVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar2,lVar3);
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> DiceRoller::roll(int numDice) {
    auto* results = new std::vector<int>();
    for (int i = 0; i < numDice; i++) {
        int result = Dice::roll();
        results->push_back(result);
        saveRoll(result);
    }

    std::sort(results->begin(), results->end());
    return *results;
}